

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.h
# Opt level: O1

size_t __thiscall
xemmai::t_context::f_tail<&xemmai::t_type_of<xemmai::t_object>::f_less_equal>
          (t_context *this,t_object *a_this)

{
  t_pvalue *ptVar1;
  size_t sVar2;
  t_pvalue *ptVar3;
  long lVar4;
  long lVar5;
  long in_FS_OFFSET;
  
  ptVar3 = this->v_base + *(long *)(this->v_lambda->v_data + 0x28);
  sVar2 = (*a_this->v_type->f_less_equal)(a_this,ptVar3);
  if (sVar2 == 0xffffffffffffffff) {
    ptVar1 = this->v_base;
    ptVar1[-2].super_t_pointer.v_p = (ptVar3->super_t_pointer).v_p;
    ptVar1[-2].field_0 = ptVar3->field_0;
    ptVar3 = this->v_previous;
  }
  else {
    lVar4 = (long)(sVar2 * 0x10 + 0x20) >> 4;
    if (0 < lVar4) {
      ptVar1 = this->v_base;
      lVar4 = lVar4 + 1;
      lVar5 = 0;
      do {
        *(undefined8 *)((long)&ptVar1[-2].super_t_pointer.v_p + lVar5) =
             *(undefined8 *)((long)&(ptVar3->super_t_pointer).v_p + lVar5);
        *(undefined8 *)((long)ptVar1 + lVar5 + -0x18) =
             *(undefined8 *)((long)&ptVar3->field_0 + lVar5);
        lVar4 = lVar4 + -1;
        lVar5 = lVar5 + 0x10;
      } while (1 < lVar4);
    }
    ptVar3 = this->v_base + sVar2;
    if (this->v_base + sVar2 <= this->v_previous) {
      ptVar3 = this->v_previous;
    }
  }
  *(t_pvalue **)(in_FS_OFFSET + -0x30) = ptVar3;
  return sVar2;
}

Assistant:

size_t t_context::f_tail(t_object* a_this)
{
	auto stack = v_base + v_lambda->f_as<t_lambda>().v_privates;
	size_t n = (a_this->f_type()->*A_function)(a_this, stack);
	if (n == size_t(-1))
		f_return(stack[0]);
	else
		f_tail(stack, n);
	return n;
}